

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_line_from_file(FILE *fp,char **p)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *p2;
  int local_30;
  int alen;
  int allocsize;
  int llen;
  int r;
  int c;
  char **p_local;
  FILE *fp_local;
  
  if (fp == (FILE *)0x0) {
    fp_local._4_4_ = 0x16a;
  }
  else if (p == (char **)0x0) {
    fp_local._4_4_ = 0x16a;
  }
  else {
    allocsize = 0;
    alen = 0;
    pcVar3 = (char *)malloc(1);
    *p = pcVar3;
    local_30 = 1;
    if (*p == (char *)0x0) {
      fp_local._4_4_ = 0x168;
    }
    else {
      while( true ) {
        do {
          iVar1 = getc((FILE *)fp);
        } while (iVar1 == 0xd);
        if (iVar1 == -1) break;
        if (iVar1 == 10) goto LAB_00217212;
        iVar2 = ((alen + 0x3e9) / 1000) * 1000;
        if (local_30 < iVar2) {
          pcVar3 = (char *)realloc(*p,(long)iVar2);
          if (pcVar3 == (char *)0x0) {
            allocsize = 0x168;
            alen = alen + 1;
            goto LAB_00217212;
          }
          *p = pcVar3;
          local_30 = iVar2;
        }
        (*p)[alen] = (char)iVar1;
        alen = alen + 1;
      }
      iVar1 = ferror((FILE *)fp);
      if (iVar1 != 0) {
        allocsize = 0x169;
      }
      if (alen == 0) {
        return 0x16f;
      }
LAB_00217212:
      if (alen + 1 == local_30) {
        (*p)[alen] = '\0';
      }
      else {
        pcVar3 = (char *)realloc(*p,(long)(alen + 1));
        if (pcVar3 == (char *)0x0) {
          allocsize = 0x168;
        }
        else {
          *p = pcVar3;
          (*p)[alen] = '\0';
        }
      }
      if ((allocsize != 0x16f) && (allocsize != 0)) {
        free(*p);
        *p = (char *)0x0;
      }
      fp_local._4_4_ = allocsize;
    }
  }
  return fp_local._4_4_;
}

Assistant:

int	ngp_line_from_file(FILE *fp, char **p)
 { int	c, r, llen, allocsize, alen;
   char	*p2;

   if (NULL == fp) return(NGP_NUL_PTR);		/* check for stupid args */
   if (NULL == p) return(NGP_NUL_PTR);		/* more foolproof checks */
   
   r = NGP_OK;					/* initialize stuff, reset err code */
   llen = 0;					/* 0 characters read so far */
   *p = (char *)ngp_alloc(1);			/* preallocate 1 byte */
   allocsize = 1;				/* signal that we have allocated 1 byte */
   if (NULL == *p) return(NGP_NO_MEMORY);	/* if this failed, system is in dire straits */

   for (;;)
    { c = getc(fp);				/* get next character */
      if ('\r' == c) continue;			/* carriage return character ?  Just ignore it */
      if (EOF == c)				/* EOF signalled ? */
        { 
          if (ferror(fp)) r = NGP_READ_ERR;	/* was it real error or simply EOF ? */
	  if (0 == llen) return(NGP_EOF);	/* signal EOF only if 0 characters read so far */
          break;
        }
      if ('\n' == c) break;			/* end of line character ? */
      
      llen++;					/* we have new character, make room for it */
      alen = ((llen + NGP_ALLOCCHUNK) / NGP_ALLOCCHUNK) * NGP_ALLOCCHUNK;
      if (alen > allocsize)
        { p2 = (char *)ngp_realloc(*p, alen);	/* realloc buffer, if there is need */
          if (NULL == p2)
            { r = NGP_NO_MEMORY;
              break;
            }
	  *p = p2;
          allocsize = alen;
        }
      (*p)[llen - 1] = c;			/* copy character to buffer */
    }

   llen++;					/* place for terminating \0 */
   if (llen != allocsize)
     { p2 = (char *)ngp_realloc(*p, llen);
       if (NULL == p2) r = NGP_NO_MEMORY;
       else
         { *p = p2;
           (*p)[llen - 1] = 0;			/* copy \0 to buffer */
         }         
     }
   else
     { (*p)[llen - 1] = 0;			/* necessary when line read was empty */
     }

   if ((NGP_EOF != r) && (NGP_OK != r))		/* in case of errors free resources */
     { ngp_free(*p);
       *p = NULL;
     }
   
   return(r);					/* return  status code */
 }